

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O0

bool __thiscall
OpenMD::MoleculeStamp::addInversionStamp(MoleculeStamp *this,InversionStamp *inversion)

{
  value_type *in_RDI;
  vector<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_> *unaff_retaddr;
  
  std::vector<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>::push_back
            (unaff_retaddr,in_RDI);
  return true;
}

Assistant:

bool MoleculeStamp::addInversionStamp(InversionStamp* inversion) {
    inversionStamps_.push_back(inversion);
    return true;
  }